

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.h
# Opt level: O0

ustring * dlib::convert_utf8_to_utf32(string *str)

{
  invalid_utf8_error *this;
  string *in_RSI;
  ustring *in_RDI;
  unichar ch;
  int status;
  istringstream sin;
  ustring *temp;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_fffffffffffffe30;
  ustring *__res;
  istream *in_stack_fffffffffffffe50;
  uint in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  istringstream local_198 [391];
  byte local_11;
  string *local_10;
  
  local_11 = 0;
  __res = in_RDI;
  local_10 = in_RSI;
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                *)in_stack_fffffffffffffe50);
  std::__cxx11::istringstream::istringstream(local_198,local_10,_S_in);
  std::__cxx11::string::size();
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::reserve
            ((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
              *)in_stack_fffffffffffffe50,(size_type)__res);
  while( true ) {
    in_stack_fffffffffffffe58 =
         unicode_helpers::u8_to_u32<unsigned_int>
                   ((uint *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                    in_stack_fffffffffffffe50);
    if ((int)in_stack_fffffffffffffe58 < 1) break;
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    push_back(in_RDI,in_stack_fffffffffffffe58);
  }
  if ((int)in_stack_fffffffffffffe58 < 0) {
    this = (invalid_utf8_error *)__cxa_allocate_exception(0x30);
    invalid_utf8_error::invalid_utf8_error(this);
    __cxa_throw(this,&invalid_utf8_error::typeinfo,invalid_utf8_error::~invalid_utf8_error);
  }
  local_11 = 1;
  std::__cxx11::istringstream::~istringstream(local_198);
  if ((local_11 & 1) == 0) {
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    ~basic_string(in_stack_fffffffffffffe30);
  }
  return __res;
}

Assistant:

inline const ustring convert_utf8_to_utf32 (
        const std::string& str
    )
    {
        using namespace unicode_helpers;
        ustring temp;
        std::istringstream sin(str);

        temp.reserve(str.size());

        int status;
        unichar ch;
        while ( (status = u8_to_u32(ch,sin)) > 0)
            temp.push_back(ch);

        if (status < 0)
            throw invalid_utf8_error();

        return temp;
    }